

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_galileo_rev_d.c
# Opt level: O2

mraa_board_t * mraa_intel_galileo_rev_d(void)

{
  mraa_pininfo_t *pmVar1;
  mraa_board_t *__ptr;
  mraa_adv_func_t *__ptr_00;
  mraa_pininfo_t *pmVar2;
  
  __ptr = (mraa_board_t *)calloc(1,0x5f0);
  if (__ptr != (mraa_board_t *)0x0) {
    __ptr->platform_name = "Intel Galileo Gen 1";
    __ptr->phy_pin_count = 0x14;
    __ptr->gpio_count = 0xe;
    __ptr->aio_count = 6;
    __ptr->uart_dev_count = 2;
    __ptr->adc_raw = 0xc;
    __ptr->adc_supported = 10;
    __ptr->pwm_default_period = 500;
    __ptr->pwm_max_period = 0x1f20;
    __ptr->pwm_min_period = 1;
    __ptr_00 = (mraa_adv_func_t *)calloc(1,0x288);
    __ptr->adv_func = __ptr_00;
    if (__ptr_00 != (mraa_adv_func_t *)0x0) {
      __ptr_00->gpio_mmap_setup = mraa_intel_galileo_g1_mmap_setup;
      __ptr_00->spi_lsbmode_replace = mraa_intel_galileo_g1_spi_lsbmode_replace;
      __ptr_00->pwm_init_pre = mraa_intel_galileo_g1_pwm_init_pre;
      pmVar2 = (mraa_pininfo_t *)calloc(0x19,0x2f4);
      __ptr->pins = pmVar2;
      if (pmVar2 != (mraa_pininfo_t *)0x0) {
        builtin_strncpy(pmVar2->name,"IO0",4);
        pmVar2->name[4] = '\0';
        pmVar2->name[5] = '\0';
        pmVar2->name[6] = '\0';
        pmVar2->name[7] = '\0';
        *(undefined1 *)&pmVar2->capabilities = 0x83;
        (pmVar2->gpio).pinmap = 0x32;
        (pmVar2->gpio).mux_total = 1;
        (pmVar2->gpio).mux[0].pincmd = 4;
        (pmVar2->gpio).mux[0].pin = 0x28;
        (pmVar2->gpio).mux[0].value = 1;
        (pmVar2->uart).mux_total = 1;
        (pmVar2->uart).mux[0].pincmd = 4;
        (pmVar2->uart).mux[0].pin = 0x28;
        pmVar2[1].name[0] = 'I';
        pmVar2[1].name[1] = 'O';
        pmVar2[1].name[2] = '1';
        pmVar2[1].name[3] = '\0';
        pmVar2[1].name[4] = '\0';
        pmVar2[1].name[5] = '\0';
        pmVar2[1].name[6] = '\0';
        pmVar2[1].name[7] = '\0';
        *(undefined1 *)&pmVar2[1].capabilities = 0x83;
        pmVar2[1].gpio.pinmap = 0x33;
        pmVar2[1].gpio.mux_total = 1;
        pmVar2[1].gpio.mux[0].pincmd = 4;
        pmVar2[1].gpio.mux[0].pin = 0x29;
        pmVar2[1].gpio.mux[0].value = 1;
        pmVar2[1].uart.mux_total = 1;
        pmVar2[1].uart.mux[0].pincmd = 4;
        pmVar2[1].uart.mux[0].pin = 0x29;
        pmVar2[2].name[0] = 'I';
        pmVar2[2].name[1] = 'O';
        pmVar2[2].name[2] = '2';
        pmVar2[2].name[3] = '\0';
        pmVar2[2].name[4] = '\0';
        pmVar2[2].name[5] = '\0';
        pmVar2[2].name[6] = '\0';
        pmVar2[2].name[7] = '\0';
        *(undefined1 *)&pmVar2[2].capabilities = 0xb;
        pmVar2[2].gpio.pinmap = 0x20;
        pmVar2[2].gpio.mux_total = 1;
        pmVar2[2].gpio.mux[0].pincmd = 4;
        pmVar2[2].gpio.mux[0].pin = 0x1f;
        pmVar2[2].gpio.mux[0].value = 1;
        pmVar2[2].mmap.gpio.pinmap = 0xe;
        pmVar1 = pmVar2 + 2;
        (pmVar1->mmap).mem_dev[8] = '0';
        (pmVar1->mmap).mem_dev[9] = '\0';
        (pmVar1->mmap).mem_dev[10] = '\0';
        (pmVar1->mmap).mem_dev[0xb] = '\0';
        pmVar2[2].mmap.mem_dev[0] = '/';
        pmVar2[2].mmap.mem_dev[1] = 'd';
        pmVar2[2].mmap.mem_dev[2] = 'e';
        pmVar2[2].mmap.mem_dev[3] = 'v';
        pmVar2[2].mmap.mem_dev[4] = '/';
        pmVar2[2].mmap.mem_dev[5] = 'u';
        pmVar2[2].mmap.mem_dev[6] = 'i';
        pmVar2[2].mmap.mem_dev[7] = 'o';
        pmVar2[2].mmap.gpio.mux_total = 3;
        pmVar2[2].mmap.gpio.mux[0].pincmd = 4;
        pmVar2[2].mmap.gpio.mux[1].pincmd = 4;
        pmVar2[2].mmap.gpio.mux[1].pin = 0x1f;
        pmVar2[2].mmap.gpio.mux[2].pincmd = 4;
        pmVar2[2].mmap.gpio.mux[2].pin = 0xe;
        pmVar2[2].mmap.mem_sz = 0x1000;
        pmVar2[2].mmap.bit_pos = 6;
        pmVar2[3].name[0] = 'I';
        pmVar2[3].name[1] = 'O';
        pmVar2[3].name[2] = '3';
        pmVar2[3].name[3] = '\0';
        pmVar2[3].name[4] = '\0';
        pmVar2[3].name[5] = '\0';
        pmVar2[3].name[6] = '\0';
        pmVar2[3].name[7] = '\0';
        *(undefined1 *)&pmVar2[3].capabilities = 0xf;
        pmVar2[3].gpio.pinmap = 0x12;
        pmVar2[3].gpio.mux_total = 1;
        pmVar2[3].gpio.mux[0].pincmd = 4;
        pmVar2[3].gpio.mux[0].pin = 0x1e;
        pmVar2[3].gpio.mux[0].value = 1;
        pmVar2[3].mmap.gpio.pinmap = 0xf;
        pmVar1 = pmVar2 + 3;
        (pmVar1->mmap).mem_dev[8] = '0';
        (pmVar1->mmap).mem_dev[9] = '\0';
        (pmVar1->mmap).mem_dev[10] = '\0';
        (pmVar1->mmap).mem_dev[0xb] = '\0';
        pmVar2[3].mmap.mem_dev[0] = '/';
        pmVar2[3].mmap.mem_dev[1] = 'd';
        pmVar2[3].mmap.mem_dev[2] = 'e';
        pmVar2[3].mmap.mem_dev[3] = 'v';
        pmVar2[3].mmap.mem_dev[4] = '/';
        pmVar2[3].mmap.mem_dev[5] = 'u';
        pmVar2[3].mmap.mem_dev[6] = 'i';
        pmVar2[3].mmap.mem_dev[7] = 'o';
        pmVar2[3].mmap.gpio.mux_total = 3;
        pmVar2[3].mmap.gpio.mux[0].pincmd = 4;
        pmVar2[3].mmap.gpio.mux[0].pin = 1;
        pmVar2[3].mmap.gpio.mux[1].pincmd = 4;
        pmVar2[3].mmap.gpio.mux[1].pin = 0x1e;
        pmVar2[3].mmap.gpio.mux[2].pincmd = 4;
        pmVar2[3].mmap.gpio.mux[2].pin = 0xf;
        pmVar2[3].mmap.mem_sz = 0x1000;
        pmVar2[3].mmap.bit_pos = 7;
        pmVar2[3].pwm.pinmap = 3;
        pmVar2[3].pwm.mux_total = 1;
        pmVar2[3].pwm.mux[0].pincmd = 4;
        pmVar2[3].pwm.mux[0].pin = 0x1e;
        pmVar2[3].pwm.mux[0].value = 1;
        pmVar2[4].name[0] = 'I';
        pmVar2[4].name[1] = 'O';
        pmVar2[4].name[2] = '4';
        pmVar2[4].name[3] = '\0';
        pmVar2[4].name[4] = '\0';
        pmVar2[4].name[5] = '\0';
        pmVar2[4].name[6] = '\0';
        pmVar2[4].name[7] = '\0';
        *(undefined1 *)&pmVar2[4].capabilities = 3;
        pmVar2[4].gpio.pinmap = 0x1c;
        pmVar2[5].name[0] = 'I';
        pmVar2[5].name[1] = 'O';
        pmVar2[5].name[2] = '5';
        pmVar2[5].name[3] = '\0';
        pmVar2[5].name[4] = '\0';
        pmVar2[5].name[5] = '\0';
        pmVar2[5].name[6] = '\0';
        pmVar2[5].name[7] = '\0';
        *(undefined1 *)&pmVar2[5].capabilities = 7;
        pmVar2[5].gpio.pinmap = 0x11;
        pmVar2[5].pwm.pinmap = 5;
        pmVar2[6].name[0] = 'I';
        pmVar2[6].name[1] = 'O';
        pmVar2[6].name[2] = '6';
        pmVar2[6].name[3] = '\0';
        pmVar2[6].name[4] = '\0';
        pmVar2[6].name[5] = '\0';
        pmVar2[6].name[6] = '\0';
        pmVar2[6].name[7] = '\0';
        pmVar2[6].gpio.pinmap = 0x18;
        *(undefined1 *)&pmVar2[6].capabilities = 7;
        pmVar2[6].pwm.pinmap = 6;
        pmVar2[7].name[0] = 'I';
        pmVar2[7].name[1] = 'O';
        pmVar2[7].name[2] = '7';
        pmVar2[7].name[3] = '\0';
        pmVar2[7].name[4] = '\0';
        pmVar2[7].name[5] = '\0';
        pmVar2[7].name[6] = '\0';
        pmVar2[7].name[7] = '\0';
        *(undefined1 *)&pmVar2[7].capabilities = 3;
        pmVar2[7].gpio.pinmap = 0x1b;
        pmVar2[8].name[0] = 'I';
        pmVar2[8].name[1] = 'O';
        pmVar2[8].name[2] = '8';
        pmVar2[8].name[3] = '\0';
        pmVar2[8].name[4] = '\0';
        pmVar2[8].name[5] = '\0';
        pmVar2[8].name[6] = '\0';
        pmVar2[8].name[7] = '\0';
        *(undefined1 *)&pmVar2[8].capabilities = 3;
        pmVar2[8].gpio.pinmap = 0x1a;
        pmVar2[9].name[0] = 'I';
        pmVar2[9].name[1] = 'O';
        pmVar2[9].name[2] = '9';
        pmVar2[9].name[3] = '\0';
        pmVar2[9].name[4] = '\0';
        pmVar2[9].name[5] = '\0';
        pmVar2[9].name[6] = '\0';
        pmVar2[9].name[7] = '\0';
        pmVar2 = __ptr->pins;
        *(undefined1 *)&pmVar2[9].capabilities = 7;
        pmVar2[9].gpio.pinmap = 0x13;
        pmVar2[9].gpio.mux_total = 0;
        pmVar2[9].pwm.pinmap = 1;
        pmVar2[9].pwm.parent_id = 0;
        pmVar2[9].pwm.mux_total = 0;
        pmVar2[10].name[0] = 'I';
        pmVar2[10].name[1] = 'O';
        pmVar2[10].name[2] = '1';
        pmVar2[10].name[3] = '0';
        pmVar2[10].name[4] = '\0';
        pmVar2[10].name[5] = '\0';
        pmVar2[10].name[6] = '\0';
        pmVar2[10].name[7] = '\0';
        *(undefined1 *)&pmVar2[10].capabilities = 0x17;
        pmVar2[10].gpio.pinmap = 0x10;
        pmVar2[10].gpio.mux_total = 1;
        pmVar2[10].gpio.mux[0].pincmd = 4;
        pmVar2[10].gpio.mux[0].pin = 0x2a;
        pmVar2[10].gpio.mux[0].value = 1;
        pmVar2[10].pwm.pinmap = 7;
        pmVar2[10].pwm.parent_id = 0;
        pmVar2[10].pwm.mux_total = 1;
        pmVar2[10].pwm.mux[0].pincmd = 4;
        pmVar2[10].pwm.mux[0].pin = 0x2a;
        pmVar2[10].pwm.mux[0].value = 1;
        pmVar2[10].spi.pinmap = 1;
        pmVar2[10].spi.mux_total = 1;
        pmVar2[10].spi.mux[0].pincmd = 4;
        pmVar2[10].spi.mux[0].pin = 0x2a;
        pmVar2[10].spi.mux[0].value = 0;
        pmVar2[0xb].name[0] = 'I';
        pmVar2[0xb].name[1] = 'O';
        pmVar2[0xb].name[2] = '1';
        pmVar2[0xb].name[3] = '1';
        pmVar2[0xb].name[4] = '\0';
        pmVar2[0xb].name[5] = '\0';
        pmVar2[0xb].name[6] = '\0';
        pmVar2[0xb].name[7] = '\0';
        *(undefined1 *)&pmVar2[0xb].capabilities = 0x17;
        pmVar2[0xb].gpio.pinmap = 0x19;
        pmVar2[0xb].gpio.mux_total = 1;
        pmVar2[0xb].gpio.mux[0].pincmd = 4;
        pmVar2[0xb].gpio.mux[0].pin = 0x2b;
        pmVar2[0xb].gpio.mux[0].value = 1;
        pmVar2[0xb].pwm.pinmap = 4;
        pmVar2[0xb].pwm.parent_id = 0;
        pmVar2[0xb].pwm.mux_total = 1;
        pmVar2[0xb].pwm.mux[0].pincmd = 4;
        pmVar2[0xb].pwm.mux[0].pin = 0x2b;
        pmVar2[0xb].pwm.mux[0].value = 1;
        pmVar2[0xb].spi.pinmap = 1;
        pmVar2[0xb].spi.mux_total = 1;
        pmVar2[0xb].spi.mux[0].pincmd = 4;
        pmVar2[0xb].spi.mux[0].pin = 0x2b;
        pmVar2[0xb].spi.mux[0].value = 0;
        pmVar2[0xc].name[0] = 'I';
        pmVar2[0xc].name[1] = 'O';
        pmVar2[0xc].name[2] = '1';
        pmVar2[0xc].name[3] = '2';
        pmVar2[0xc].name[4] = '\0';
        pmVar2[0xc].name[5] = '\0';
        pmVar2[0xc].name[6] = '\0';
        pmVar2[0xc].name[7] = '\0';
        *(undefined1 *)&pmVar2[0xc].capabilities = 0x13;
        pmVar2[0xc].gpio.pinmap = 0x26;
        pmVar2[0xc].gpio.mux_total = 1;
        pmVar2[0xc].gpio.mux[0].pincmd = 4;
        pmVar2[0xc].gpio.mux[0].pin = 0x36;
        pmVar2[0xc].gpio.mux[0].value = 1;
        pmVar2[0xc].spi.pinmap = 1;
        pmVar2[0xc].spi.mux_total = 1;
        pmVar2[0xc].spi.mux[0].pincmd = 4;
        pmVar2[0xc].spi.mux[0].pin = 0x36;
        pmVar2[0xc].spi.mux[0].value = 0;
        pmVar2[0xd].name[0] = 'I';
        pmVar2[0xd].name[1] = 'O';
        pmVar2[0xd].name[2] = '1';
        pmVar2[0xd].name[3] = '3';
        pmVar2[0xd].name[4] = '\0';
        pmVar2[0xd].name[5] = '\0';
        pmVar2[0xd].name[6] = '\0';
        pmVar2[0xd].name[7] = '\0';
        pmVar2 = __ptr->pins;
        *(undefined1 *)&pmVar2[0xd].capabilities = 0x13;
        pmVar2[0xd].gpio.pinmap = 0x27;
        pmVar2[0xd].gpio.mux_total = 1;
        pmVar2[0xd].gpio.mux[0].pincmd = 4;
        pmVar2[0xd].gpio.mux[0].pin = 0x37;
        pmVar2[0xd].gpio.mux[0].value = 1;
        pmVar2[0xd].spi.pinmap = 1;
        pmVar2[0xd].spi.mux_total = 1;
        pmVar2[0xd].spi.mux[0].pincmd = 4;
        pmVar2[0xd].spi.mux[0].pin = 0x37;
        pmVar2[0xd].spi.mux[0].value = 0;
        pmVar2[0xe].name[0] = 'A';
        pmVar2[0xe].name[1] = '0';
        pmVar2[0xe].name[2] = '\0';
        pmVar2[0xe].name[3] = '\0';
        pmVar2[0xe].name[4] = '\0';
        pmVar2[0xe].name[5] = '\0';
        pmVar2[0xe].name[6] = '\0';
        pmVar2[0xe].name[7] = '\0';
        *(undefined1 *)&pmVar2[0xe].capabilities = 0x43;
        pmVar2[0xe].gpio.pinmap = 0x2c;
        pmVar2[0xe].gpio.mux_total = 1;
        pmVar2[0xe].gpio.mux[0].pincmd = 4;
        pmVar2[0xe].gpio.mux[0].pin = 0x25;
        pmVar2[0xe].gpio.mux[0].value = 1;
        pmVar2[0xe].aio.pinmap = 0;
        pmVar2[0xe].aio.mux_total = 1;
        pmVar2[0xe].aio.mux[0].pincmd = 4;
        pmVar2[0xe].aio.mux[0].pin = 0x25;
        pmVar2[0xe].aio.mux[0].value = 0;
        pmVar2[0xf].name[0] = 'A';
        pmVar2[0xf].name[1] = '1';
        pmVar2[0xf].name[2] = '\0';
        pmVar2[0xf].name[3] = '\0';
        pmVar2[0xf].name[4] = '\0';
        pmVar2[0xf].name[5] = '\0';
        pmVar2[0xf].name[6] = '\0';
        pmVar2[0xf].name[7] = '\0';
        *(undefined1 *)&pmVar2[0xf].capabilities = 0x43;
        pmVar2[0xf].gpio.pinmap = 0x2d;
        pmVar2[0xf].gpio.mux_total = 1;
        pmVar2[0xf].gpio.mux[0].pincmd = 4;
        pmVar2[0xf].gpio.mux[0].pin = 0x24;
        pmVar2[0xf].gpio.mux[0].value = 1;
        pmVar2[0xf].aio.pinmap = 1;
        pmVar2[0xf].aio.mux_total = 1;
        pmVar2[0xf].aio.mux[0].pincmd = 4;
        pmVar2[0xf].aio.mux[0].pin = 0x24;
        pmVar2[0xf].aio.mux[0].value = 0;
        pmVar2[0x10].name[0] = 'A';
        pmVar2[0x10].name[1] = '2';
        pmVar2[0x10].name[2] = '\0';
        pmVar2[0x10].name[3] = '\0';
        pmVar2[0x10].name[4] = '\0';
        pmVar2[0x10].name[5] = '\0';
        pmVar2[0x10].name[6] = '\0';
        pmVar2[0x10].name[7] = '\0';
        *(undefined1 *)&pmVar2[0x10].capabilities = 0x43;
        pmVar2[0x10].gpio.pinmap = 0x2e;
        pmVar2[0x10].gpio.mux_total = 1;
        pmVar2[0x10].gpio.mux[0].pincmd = 4;
        pmVar2[0x10].gpio.mux[0].pin = 0x17;
        pmVar2[0x10].gpio.mux[0].value = 1;
        pmVar2[0x10].aio.pinmap = 2;
        pmVar2[0x10].aio.mux_total = 1;
        pmVar2[0x10].aio.mux[0].pincmd = 4;
        pmVar2[0x10].aio.mux[0].pin = 0x17;
        pmVar2[0x10].aio.mux[0].value = 0;
        pmVar2[0x11].name[0] = 'A';
        pmVar2[0x11].name[1] = '3';
        pmVar2[0x11].name[2] = '\0';
        pmVar2[0x11].name[3] = '\0';
        pmVar2[0x11].name[4] = '\0';
        pmVar2[0x11].name[5] = '\0';
        pmVar2[0x11].name[6] = '\0';
        pmVar2[0x11].name[7] = '\0';
        *(undefined1 *)&pmVar2[0x11].capabilities = 0x43;
        pmVar2[0x11].gpio.pinmap = 0x2f;
        pmVar2[0x11].gpio.mux_total = 1;
        pmVar2[0x11].gpio.mux[0].pincmd = 4;
        pmVar2[0x11].gpio.mux[0].pin = 0x16;
        pmVar2[0x11].gpio.mux[0].value = 1;
        pmVar2[0x11].aio.pinmap = 3;
        pmVar2[0x11].aio.mux_total = 1;
        pmVar2[0x11].aio.mux[0].pincmd = 4;
        pmVar2[0x11].aio.mux[0].pin = 0x16;
        pmVar2[0x11].aio.mux[0].value = 0;
        pmVar2[0x12].name[0] = 'A';
        pmVar2[0x12].name[1] = '4';
        pmVar2[0x12].name[2] = '\0';
        pmVar2[0x12].name[3] = '\0';
        pmVar2[0x12].name[4] = '\0';
        pmVar2[0x12].name[5] = '\0';
        pmVar2[0x12].name[6] = '\0';
        pmVar2[0x12].name[7] = '\0';
        pmVar2 = __ptr->pins;
        *(undefined1 *)&pmVar2[0x12].capabilities = 99;
        pmVar2[0x12].gpio.pinmap = 0x30;
        pmVar2[0x12].gpio.mux_total = 2;
        pmVar2[0x12].gpio.mux[0].pincmd = 4;
        pmVar2[0x12].gpio.mux[0].pin = 0x1d;
        pmVar2[0x12].gpio.mux[0].value = 1;
        pmVar2[0x12].gpio.mux[1].pincmd = 4;
        pmVar2[0x12].gpio.mux[1].pin = 0x15;
        pmVar2[0x12].gpio.mux[1].value = 1;
        pmVar2[0x12].i2c.pinmap = 1;
        pmVar2[0x12].i2c.mux_total = 1;
        pmVar2[0x12].i2c.mux[0].pincmd = 4;
        pmVar2[0x12].i2c.mux[0].pin = 0x1d;
        pmVar2[0x12].i2c.mux[0].value = 0;
        pmVar2[0x12].aio.pinmap = 4;
        pmVar2[0x12].aio.mux_total = 2;
        pmVar2[0x12].aio.mux[0].pincmd = 4;
        pmVar2[0x12].aio.mux[0].pin = 0x1d;
        pmVar2[0x12].aio.mux[0].value = 1;
        pmVar2[0x12].aio.mux[1].pincmd = 4;
        pmVar2[0x12].aio.mux[1].pin = 0x15;
        pmVar2[0x12].aio.mux[1].value = 0;
        pmVar2[0x13].name[0] = 'A';
        pmVar2[0x13].name[1] = '5';
        pmVar2[0x13].name[2] = '\0';
        pmVar2[0x13].name[3] = '\0';
        pmVar2[0x13].name[4] = '\0';
        pmVar2[0x13].name[5] = '\0';
        pmVar2[0x13].name[6] = '\0';
        pmVar2[0x13].name[7] = '\0';
        *(undefined1 *)&pmVar2[0x13].capabilities = 99;
        pmVar2[0x13].gpio.pinmap = 0x31;
        pmVar2[0x13].gpio.mux_total = 2;
        pmVar2[0x13].gpio.mux[0].pincmd = 4;
        pmVar2[0x13].gpio.mux[0].pin = 0x1d;
        pmVar2[0x13].gpio.mux[0].value = 1;
        pmVar2[0x13].gpio.mux[1].pincmd = 4;
        pmVar2[0x13].gpio.mux[1].pin = 0x14;
        pmVar2[0x13].gpio.mux[1].value = 1;
        pmVar2[0x13].i2c.pinmap = 1;
        pmVar2[0x13].i2c.mux_total = 1;
        pmVar2[0x13].i2c.mux[0].pincmd = 4;
        pmVar2[0x13].i2c.mux[0].pin = 0x1d;
        pmVar2[0x13].i2c.mux[0].value = 0;
        pmVar2[0x13].aio.pinmap = 5;
        pmVar2[0x13].aio.mux_total = 2;
        pmVar2[0x13].aio.mux[0].pincmd = 4;
        pmVar2[0x13].aio.mux[0].pin = 0x1d;
        pmVar2[0x13].aio.mux[0].value = 1;
        pmVar2[0x13].aio.mux[1].pincmd = 4;
        pmVar2[0x13].aio.mux[1].pin = 0x14;
        pmVar2[0x13].aio.mux[1].value = 0;
        __ptr->i2c_bus_count = 1;
        __ptr->def_i2c_bus = 0;
        __ptr->spi_bus_count = 1;
        __ptr->i2c_bus[0].bus_id = 0;
        __ptr->i2c_bus[0].scl = 0x13;
        __ptr->i2c_bus[0].sda = 0x12;
        __ptr->def_spi_bus = 0;
        __ptr->spi_bus[0].bus_id = 1;
        __ptr->spi_bus[0].slave_s = 0;
        __ptr->spi_bus[0].sclk = 0xd;
        __ptr->spi_bus[0].mosi = 0xb;
        __ptr->spi_bus[0].miso = 0xc;
        __ptr->spi_bus[0].cs = 10;
        __ptr->uart_dev_count = 2;
        __ptr->def_uart_dev = 0;
        __ptr->uart_dev[0].rx = 0;
        __ptr->uart_dev[0].tx = 1;
        __ptr->uart_dev[0].device_path = "/dev/ttyS0";
        __ptr->uart_dev[1].rx = -1;
        __ptr->uart_dev[1].tx = -1;
        __ptr->uart_dev[1].device_path = "/dev/ttyS1";
        return __ptr;
      }
      free(__ptr_00);
    }
    syslog(2,"galileo1: Platform failed to initialise");
    free(__ptr);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_galileo_rev_d()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->phy_pin_count = 20;
    b->gpio_count = 14;
    b->aio_count = 6;
    b->uart_dev_count = 2;

    b->adc_raw = 12;
    b->adc_supported = 10;
    b->pwm_default_period = 500;
    b->pwm_max_period = 7968;
    b->pwm_min_period = 1;

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        goto error;
    }
    b->adv_func->gpio_mmap_setup = &mraa_intel_galileo_g1_mmap_setup;
    b->adv_func->spi_lsbmode_replace = &mraa_intel_galileo_g1_spi_lsbmode_replace;
    b->adv_func->pwm_init_pre = mraa_intel_galileo_g1_pwm_init_pre;

    b->pins = (mraa_pininfo_t*) calloc(MRAA_INTEL_GALILEO_REV_D_PINCOUNT, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        free(b->adv_func);
        goto error;
    }

    // GPIO IO0 - IO10
    strncpy(b->pins[0].name, "IO0", 8);
    b->pins[0].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[0].gpio.pinmap = 50;
    b->pins[0].gpio.parent_id = 0;
    b->pins[0].gpio.mux_total = 1;
    b->pins[0].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[0].gpio.mux[0].pin = 40;
    b->pins[0].gpio.mux[0].value = 1;
    b->pins[0].uart.pinmap = 0;
    b->pins[0].uart.parent_id = 0;
    b->pins[0].uart.mux_total = 1;
    b->pins[0].uart.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[0].uart.mux[0].pin = 40;
    b->pins[0].uart.mux[0].value = 0;

    strncpy(b->pins[1].name, "IO1", 8);
    b->pins[1].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[1].gpio.pinmap = 51;
    b->pins[1].gpio.mux_total = 1;
    b->pins[1].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[1].gpio.mux[0].pin = 41;
    b->pins[1].gpio.mux[0].value = 1;
    b->pins[1].uart.pinmap = 0;
    b->pins[1].uart.parent_id = 0;
    b->pins[1].uart.mux_total = 1;
    b->pins[1].uart.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[1].uart.mux[0].pin = 41;
    b->pins[1].uart.mux[0].value = 0;

    strncpy(b->pins[2].name, "IO2", 8);
    b->pins[2].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 1, 0, 0, 0, 0 };
    b->pins[2].gpio.pinmap = 32;
    b->pins[2].gpio.mux_total = 1;
    b->pins[2].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[2].gpio.mux[0].pin = 31;
    b->pins[2].gpio.mux[0].value = 1;
    b->pins[2].mmap.gpio.pinmap = 14;
    strncpy(b->pins[2].mmap.mem_dev, "/dev/uio0", 12);
    b->pins[2].mmap.gpio.mux_total = 3;
    b->pins[2].mmap.gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[2].mmap.gpio.mux[0].pin = 0;
    b->pins[2].mmap.gpio.mux[0].value = 0;
    b->pins[2].mmap.gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[2].mmap.gpio.mux[1].pin = 31;
    b->pins[2].mmap.gpio.mux[1].value = 0;
    b->pins[2].mmap.gpio.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[2].mmap.gpio.mux[2].pin = 14;
    b->pins[2].mmap.gpio.mux[2].value = 0;
    b->pins[2].mmap.mem_sz = 0x1000;
    b->pins[2].mmap.bit_pos = 6;

    strncpy(b->pins[3].name, "IO3", 8);
    b->pins[3].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 1, 0, 0, 0, 0 };
    b->pins[3].gpio.pinmap = 18;
    b->pins[3].gpio.mux_total = 1;
    b->pins[3].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[3].gpio.mux[0].pin = 30;
    b->pins[3].gpio.mux[0].value = 1;
    b->pins[3].mmap.gpio.pinmap = 15;
    strncpy(b->pins[3].mmap.mem_dev, "/dev/uio0", 12);
    b->pins[3].mmap.gpio.mux_total = 3;
    b->pins[3].mmap.gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[3].mmap.gpio.mux[0].pin = 1;
    b->pins[3].mmap.gpio.mux[0].value = 0;
    b->pins[3].mmap.gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[3].mmap.gpio.mux[1].pin = 30;
    b->pins[3].mmap.gpio.mux[1].value = 0;
    b->pins[3].mmap.gpio.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[3].mmap.gpio.mux[2].pin = 15;
    b->pins[3].mmap.gpio.mux[2].value = 0;
    b->pins[3].mmap.mem_sz = 0x1000;
    b->pins[3].mmap.bit_pos = 7;
    b->pins[3].pwm.pinmap = 3;
    b->pins[3].pwm.parent_id = 0;
    b->pins[3].pwm.mux_total = 1;
    b->pins[3].pwm.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[3].pwm.mux[0].pin = 30;
    b->pins[3].pwm.mux[0].value = 1;


    strncpy(b->pins[4].name, "IO4", 8);
    b->pins[4].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[4].gpio.pinmap = 28;
    b->pins[4].gpio.mux_total = 0;

    strncpy(b->pins[5].name, "IO5", 8);
    b->pins[5].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[5].gpio.pinmap = 17;
    b->pins[5].gpio.mux_total = 0;
    b->pins[5].pwm.pinmap = 5;
    b->pins[5].pwm.parent_id = 0;
    b->pins[5].pwm.mux_total = 0;

    strncpy(b->pins[6].name, "IO6", 8);
    b->pins[6].gpio.pinmap = 24;
    b->pins[6].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[6].gpio.mux_total = 0;
    b->pins[6].pwm.pinmap = 6;
    b->pins[6].pwm.parent_id = 0;
    b->pins[6].pwm.mux_total = 0;

    strncpy(b->pins[7].name, "IO7", 8);
    b->pins[7].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[7].gpio.pinmap = 27;
    b->pins[7].gpio.mux_total = 0;

    strncpy(b->pins[8].name, "IO8", 8);
    b->pins[8].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[8].gpio.pinmap = 26;
    b->pins[8].gpio.mux_total = 0;

    strncpy(b->pins[9].name, "IO9", 8);
    b->pins[9].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[9].gpio.pinmap = 19;
    b->pins[9].gpio.mux_total = 0;
    b->pins[9].pwm.pinmap = 1;
    b->pins[9].pwm.parent_id = 0;
    b->pins[9].pwm.mux_total = 0;

    strncpy(b->pins[10].name, "IO10", 8);
    b->pins[10].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 1, 0, 0, 0 };
    b->pins[10].gpio.pinmap = 16;
    b->pins[10].gpio.mux_total = 1;
    b->pins[10].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].gpio.mux[0].pin = 42;
    b->pins[10].gpio.mux[0].value = 1;
    b->pins[10].pwm.pinmap = 7;
    b->pins[10].pwm.parent_id = 0;
    b->pins[10].pwm.mux_total = 1;
    b->pins[10].pwm.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].pwm.mux[0].pin = 42;
    b->pins[10].pwm.mux[0].value = 1;
    b->pins[10].spi.pinmap = 1;
    b->pins[10].spi.mux_total = 1;
    b->pins[10].spi.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].spi.mux[0].pin = 42;
    b->pins[10].spi.mux[0].value = 0;

    strncpy(b->pins[11].name, "IO11", 8);
    b->pins[11].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 1, 0, 0, 0 };
    b->pins[11].gpio.pinmap = 25;
    b->pins[11].gpio.mux_total = 1;
    b->pins[11].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].gpio.mux[0].pin = 43;
    b->pins[11].gpio.mux[0].value = 1;
    b->pins[11].pwm.pinmap = 4;
    b->pins[11].pwm.parent_id = 0;
    b->pins[11].pwm.mux_total = 1;
    b->pins[11].pwm.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].pwm.mux[0].pin = 43;
    b->pins[11].pwm.mux[0].value = 1;
    b->pins[11].spi.pinmap = 1;
    b->pins[11].spi.mux_total = 1;
    b->pins[11].spi.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].spi.mux[0].pin = 43;
    b->pins[11].spi.mux[0].value = 0;

    strncpy(b->pins[12].name, "IO12", 8);
    b->pins[12].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[12].gpio.pinmap = 38;
    b->pins[12].gpio.mux_total = 1;
    b->pins[12].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[12].gpio.mux[0].pin = 54;
    b->pins[12].gpio.mux[0].value = 1;
    b->pins[12].spi.pinmap = 1;
    b->pins[12].spi.mux_total = 1;
    b->pins[12].spi.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[12].spi.mux[0].pin = 54;
    b->pins[12].spi.mux[0].value = 0;

    strncpy(b->pins[13].name, "IO13", 8);
    b->pins[13].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[13].gpio.pinmap = 39;
    b->pins[13].gpio.mux_total = 1;
    b->pins[13].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[13].gpio.mux[0].pin = 55;
    b->pins[13].gpio.mux[0].value = 1;
    b->pins[13].spi.pinmap = 1;
    b->pins[13].spi.mux_total = 1;
    b->pins[13].spi.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[13].spi.mux[0].pin = 55;
    b->pins[13].spi.mux[0].value = 0;

    strncpy(b->pins[14].name, "A0", 8);
    b->pins[14].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[14].gpio.pinmap = 44;
    b->pins[14].gpio.mux_total = 1;
    b->pins[14].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[14].gpio.mux[0].pin = 37;
    b->pins[14].gpio.mux[0].value = 1;
    b->pins[14].aio.pinmap = 0;
    b->pins[14].aio.mux_total = 1;
    b->pins[14].aio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[14].aio.mux[0].pin = 37;
    b->pins[14].aio.mux[0].value = 0;

    strncpy(b->pins[15].name, "A1", 8);
    b->pins[15].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[15].gpio.pinmap = 45;
    b->pins[15].gpio.mux_total = 1;
    b->pins[15].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[15].gpio.mux[0].pin = 36;
    b->pins[15].gpio.mux[0].value = 1;
    b->pins[15].aio.pinmap = 1;
    b->pins[15].aio.mux_total = 1;
    b->pins[15].aio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[15].aio.mux[0].pin = 36;
    b->pins[15].aio.mux[0].value = 0;

    strncpy(b->pins[16].name, "A2", 8);
    b->pins[16].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[16].gpio.pinmap = 46;
    b->pins[16].gpio.mux_total = 1;
    b->pins[16].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[16].gpio.mux[0].pin = 23;
    b->pins[16].gpio.mux[0].value = 1;
    b->pins[16].aio.pinmap = 2;
    b->pins[16].aio.mux_total = 1;
    b->pins[16].aio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[16].aio.mux[0].pin = 23;
    b->pins[16].aio.mux[0].value = 0;

    strncpy(b->pins[17].name, "A3", 8);
    b->pins[17].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[17].gpio.pinmap = 47;
    b->pins[17].gpio.mux_total = 1;
    b->pins[17].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[17].gpio.mux[0].pin = 22;
    b->pins[17].gpio.mux[0].value = 1;
    b->pins[17].aio.pinmap = 3;
    b->pins[17].aio.mux_total = 1;
    b->pins[17].aio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[17].aio.mux[0].pin = 22;
    b->pins[17].aio.mux[0].value = 0;

    strncpy(b->pins[18].name, "A4", 8);
    b->pins[18].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 1, 0 };
    b->pins[18].gpio.pinmap = 48;
    b->pins[18].gpio.mux_total = 2;
    b->pins[18].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].gpio.mux[0].pin = 29;
    b->pins[18].gpio.mux[0].value = 1;
    b->pins[18].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].gpio.mux[1].pin = 21;
    b->pins[18].gpio.mux[1].value = 1;
    b->pins[18].i2c.pinmap = 1;
    b->pins[18].i2c.mux_total = 1;
    b->pins[18].i2c.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].i2c.mux[0].pin = 29;
    b->pins[18].i2c.mux[0].value = 0;
    b->pins[18].aio.pinmap = 4;
    b->pins[18].aio.mux_total = 2;
    b->pins[18].aio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].aio.mux[0].pin = 29;
    b->pins[18].aio.mux[0].value = 1;
    b->pins[18].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].aio.mux[1].pin = 21;
    b->pins[18].aio.mux[1].value = 0;

    strncpy(b->pins[19].name, "A5", 8);
    b->pins[19].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 1, 0 };
    b->pins[19].gpio.pinmap = 49;
    b->pins[19].gpio.mux_total = 2;
    b->pins[19].gpio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].gpio.mux[0].pin = 29;
    b->pins[19].gpio.mux[0].value = 1;
    b->pins[19].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].gpio.mux[1].pin = 20;
    b->pins[19].gpio.mux[1].value = 1;
    b->pins[19].i2c.pinmap = 1;
    b->pins[19].i2c.mux_total = 1;
    b->pins[19].i2c.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].i2c.mux[0].pin = 29;
    b->pins[19].i2c.mux[0].value = 0;
    b->pins[19].aio.pinmap = 5;
    b->pins[19].aio.mux_total = 2;
    b->pins[19].aio.mux[0].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].aio.mux[0].pin = 29;
    b->pins[19].aio.mux[0].value = 1;
    b->pins[19].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].aio.mux[1].pin = 20;
    b->pins[19].aio.mux[1].value = 0;

    // BUS DEFINITIONS
    b->i2c_bus_count = 1;
    b->def_i2c_bus = 0;
    b->i2c_bus[0].bus_id = 0;
    b->i2c_bus[0].sda = 18;
    b->i2c_bus[0].scl = 19;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 1;
    b->spi_bus[0].slave_s = 0;
    b->spi_bus[0].cs = 10;
    b->spi_bus[0].mosi = 11;
    b->spi_bus[0].miso = 12;
    b->spi_bus[0].sclk = 13;

    b->uart_dev_count = 2;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = 0;
    b->uart_dev[0].tx = 1;
    b->uart_dev[0].device_path = "/dev/ttyS0";

    b->uart_dev[1].rx = -1;
    b->uart_dev[1].tx = -1;
    b->uart_dev[1].device_path = "/dev/ttyS1";

    return b;
error:
    syslog(LOG_CRIT, "galileo1: Platform failed to initialise");
    free(b);
    return NULL;
}